

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_session.hpp
# Opt level: O1

result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
* __thiscall
m2d::savanna::url_session::
send<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
          (result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
           *__return_storage_ptr__,url_session *this,request<get_yahoo_endpoint> *request)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 *puVar5;
  _Base_ptr p_Var6;
  node_ptr plVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar8;
  dummy_u *pdVar9;
  response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  response;
  request<get_yahoo_endpoint> local_258;
  response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  local_170;
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_c8;
  
  local_258.follow_location = request->follow_location;
  local_258.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
  if ((request->endpoint).super_get_endpoint.query_.super_type.m_initialized == true) {
    local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ =
         (long)&local_258.endpoint.super_get_endpoint.query_.super_type.m_storage + 8;
    local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ =
         *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_
                  + 0x10);
    if (local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ == 0) {
      pdVar9 = &local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_;
      local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ = 0;
      local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ = 0;
      local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
           local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
    }
    else {
      puVar1 = (undefined1 *)
               ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 8
               );
      local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ =
           *(undefined4 *)
            ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 8);
      puVar5 = *(undefined1 **)
                ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ +
                0x18);
      local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
           *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.
                            dummy_ + 0x20);
      *(undefined8 *)
       (local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ + 8) =
           local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
      pdVar9 = &(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_;
      local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._40_8_ =
           *(undefined8 *)
            ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x28
            );
      *(undefined8 *)
       ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x10) = 0
      ;
      *(undefined1 **)
       ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x18) =
           puVar1;
      *(undefined1 **)
       ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x20) =
           puVar1;
      local_258.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ = puVar5;
    }
    *(undefined8 *)((long)pdVar9 + 0x28) = 0;
    local_258.endpoint.super_get_endpoint.query_.super_type.m_initialized = true;
  }
  paVar4 = &local_258.body.field_2;
  local_258.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
       (_func_int **)&PTR_scheme_abi_cxx11__00218168;
  local_258.version = request->version;
  local_258.body._M_dataplus._M_p = (request->body)._M_dataplus._M_p;
  paVar2 = &(request->body).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.body._M_dataplus._M_p == paVar2) {
    local_258.body.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_258.body.field_2._8_8_ = *(undefined8 *)((long)&(request->body).field_2 + 8);
    local_258.body._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_258.body.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_258.body._M_string_length = (request->body)._M_string_length;
  local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header;
  (request->body)._M_dataplus._M_p = (pointer)paVar2;
  (request->body)._M_string_length = 0;
  (request->body).field_2._M_local_buf[0] = '\0';
  local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
      (_Base_ptr)0x0) {
    pmVar8 = &local_258.header_fields;
    local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var3 = &(request->header_fields)._M_t._M_impl.super__Rb_tree_header;
    local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    p_Var6 = (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&(request->header_fields)._M_t._M_impl;
    local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var3->_M_header;
    (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var3->_M_header;
    local_258.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var6;
  }
  *(size_t *)((long)&(pmVar8->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
  local_258.timeout_interval.__r = (request->timeout_interval).__r;
  send_request<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
            (&local_170,this,&local_258);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_258.header_fields._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.body._M_dataplus._M_p != paVar4) {
    operator_delete(local_258.body._M_dataplus._M_p);
  }
  local_258.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
       (_func_int **)&PTR_scheme_abi_cxx11__00218200;
  if (local_258.endpoint.super_get_endpoint.query_.super_type.m_initialized == true) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_258.endpoint.super_get_endpoint.query_.super_type.m_storage);
    local_258.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::basic_fields
            ((basic_fields<std::allocator<char>_> *)&local_c8,
             (basic_fields<std::allocator<char>_> *)&local_170);
  local_c8.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.version_ =
       local_170.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
       version_;
  local_c8.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.result_ =
       local_170.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
       result_;
  boost::beast::basic_multi_buffer<std::allocator<char>_>::basic_multi_buffer
            (&local_c8.
              super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
              value_,&local_170.
                      super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                      .value_);
  (__return_storage_ptr__->response).super_type.m_initialized = false;
  boost::beast::http::
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message((message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
             *)&(__return_storage_ptr__->response).super_type.m_storage,&local_c8);
  (__return_storage_ptr__->response).super_type.m_initialized = true;
  (__return_storage_ptr__->error).super_type.m_initialized = false;
  while (local_c8.
         super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
         value_.list_.data_.root_plus_size_.m_header.super_node.next_ !=
         (node_ptr)
         ((long)&local_c8.
                 super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                 .value_.list_.data_.root_plus_size_ + 8U)) {
    plVar7 = (local_c8.
              super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
              value_.list_.data_.root_plus_size_.m_header.super_node.next_)->next_;
    operator_delete(local_c8.
                    super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                    .value_.list_.data_.root_plus_size_.m_header.super_node.next_);
    local_c8.super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
    value_.list_.data_.root_plus_size_.m_header.super_node.next_ = plVar7;
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)&local_c8);
  while (local_170.
         super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
         value_.list_.data_.root_plus_size_.m_header.super_node.next_ !=
         (node_ptr)
         ((long)&local_170.
                 super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                 .value_.list_.data_.root_plus_size_ + 8U)) {
    plVar7 = (local_170.
              super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
              value_.list_.data_.root_plus_size_.m_header.super_node.next_)->next_;
    operator_delete(local_170.
                    super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                    .value_.list_.data_.root_plus_size_.m_header.super_node.next_);
    local_170.super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
    value_.list_.data_.root_plus_size_.m_header.super_node.next_ = plVar7;
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)&local_170);
  return __return_storage_ptr__;
}

Assistant:

savanna::result<http::response<Body>> send(savanna::request<Endpoint> request)
		{
			static_assert(std::is_base_of<endpoint, Endpoint>::value, "Endpoint not derived from endpoint");
			try {
				http::response<Body> response = send_request<Body, Endpoint>(std::move(request));
				return result<http::response<Body>>(std::move(response));
			} catch (boost::system::system_error const &e) {
				return result<http::response<Body>>(e);
			}
		}